

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Ch *s,SizeType length)

{
  GenericStringRef<char> local_20;
  
  (this->data_).n = (Number)0x0;
  (this->data_).s.str = (Ch *)0x0;
  GenericStringRef<char>::GenericStringRef(&local_20,s,length);
  (this->data_).f.flags = 0x405;
  (this->data_).s.str = (Ch *)((ulong)local_20.s | 0x405000000000000);
  (this->data_).s.length = local_20.length;
  return;
}

Assistant:

GenericValue(const Ch* s, SizeType length) RAPIDJSON_NOEXCEPT : data_() { SetStringRaw(StringRef(s, length)); }